

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::GetReservoirQuantileListAggregateFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType LVar1;
  NotImplementedException *pNVar2;
  LogicalType *in_RDX;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  switch(*type) {
  case (LogicalType)0xb:
    GetTypedReservoirQuantileListAggregateFunction<signed_char,signed_char>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case (LogicalType)0xd:
switchD_004bd6e7_caseD_d:
    GetTypedReservoirQuantileListAggregateFunction<int,int>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case (LogicalType)0xe:
switchD_004bd6e7_caseD_e:
    GetTypedReservoirQuantileListAggregateFunction<long,long>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case (LogicalType)0xf:
  case (LogicalType)0x10:
  case (LogicalType)0x11:
  case (LogicalType)0x12:
  case (LogicalType)0x13:
  case (LogicalType)0x14:
switchD_004bd6e7_caseD_f:
    pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Unimplemented reservoir quantile list aggregate","");
    duckdb::NotImplementedException::NotImplementedException(pNVar2,(string *)local_40);
    __cxa_throw(pNVar2,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
  case (LogicalType)0x15:
    LVar1 = type[1];
    if (8 < (byte)LVar1) {
      if (LVar1 != (LogicalType)0x9) {
        if (LVar1 != (LogicalType)0xcc) goto LAB_004bd7c1;
        goto LAB_004bd7a1;
      }
      goto switchD_004bd6e7_caseD_e;
    }
    if (LVar1 != (LogicalType)0x5) {
      if (LVar1 != (LogicalType)0x7) {
LAB_004bd7c1:
        pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_40,"Unimplemented reservoir quantile list aggregate","");
        duckdb::NotImplementedException::NotImplementedException(pNVar2,(string *)local_40);
        __cxa_throw(pNVar2,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
      }
      goto switchD_004bd6e7_caseD_d;
    }
  case (LogicalType)0xc:
    GetTypedReservoirQuantileListAggregateFunction<short,short>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case (LogicalType)0x16:
    GetTypedReservoirQuantileListAggregateFunction<float,float>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case (LogicalType)0x17:
    GetTypedReservoirQuantileListAggregateFunction<double,double>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  default:
    if (*type != (LogicalType)0x32) goto switchD_004bd6e7_caseD_f;
LAB_004bd7a1:
    GetTypedReservoirQuantileListAggregateFunction<duckdb::hugeint_t,duckdb::hugeint_t>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetReservoirQuantileListAggregateFunction(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::TINYINT:
		return GetTypedReservoirQuantileListAggregateFunction<int8_t, int8_t>(type);
	case LogicalTypeId::SMALLINT:
		return GetTypedReservoirQuantileListAggregateFunction<int16_t, int16_t>(type);
	case LogicalTypeId::INTEGER:
		return GetTypedReservoirQuantileListAggregateFunction<int32_t, int32_t>(type);
	case LogicalTypeId::BIGINT:
		return GetTypedReservoirQuantileListAggregateFunction<int64_t, int64_t>(type);
	case LogicalTypeId::HUGEINT:
		return GetTypedReservoirQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
	case LogicalTypeId::FLOAT:
		return GetTypedReservoirQuantileListAggregateFunction<float, float>(type);
	case LogicalTypeId::DOUBLE:
		return GetTypedReservoirQuantileListAggregateFunction<double, double>(type);
	case LogicalTypeId::DECIMAL:
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return GetTypedReservoirQuantileListAggregateFunction<int16_t, int16_t>(type);
		case PhysicalType::INT32:
			return GetTypedReservoirQuantileListAggregateFunction<int32_t, int32_t>(type);
		case PhysicalType::INT64:
			return GetTypedReservoirQuantileListAggregateFunction<int64_t, int64_t>(type);
		case PhysicalType::INT128:
			return GetTypedReservoirQuantileListAggregateFunction<hugeint_t, hugeint_t>(type);
		default:
			throw NotImplementedException("Unimplemented reservoir quantile list aggregate");
		}
	default:
		// TODO: Add quantitative temporal types
		throw NotImplementedException("Unimplemented reservoir quantile list aggregate");
	}
}